

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.hpp
# Opt level: O0

void __thiscall
CorUnix::CSharedMemoryWaitableObject::CSharedMemoryWaitableObject
          (CSharedMemoryWaitableObject *this,CObjectType *pot,CRITICAL_SECTION *pcsObjListLock)

{
  CRITICAL_SECTION *pcsObjListLock_local;
  CObjectType *pot_local;
  CSharedMemoryWaitableObject *this_local;
  
  CSharedMemoryObject::CSharedMemoryObject(&this->super_CSharedMemoryObject,pot,pcsObjListLock);
  (this->super_CSharedMemoryObject).super_CPalObjectBase.super_IPalObject._vptr_IPalObject =
       (_func_int **)&PTR_GetObjectType_01dc3ed8;
  this->m_pvSynchData = (VOID *)0x0;
  return;
}

Assistant:

CSharedMemoryWaitableObject(
            CObjectType *pot,
            CRITICAL_SECTION *pcsObjListLock
            )
            :
            CSharedMemoryObject(pot, pcsObjListLock),
            m_pvSynchData(NULL)
        {
        }